

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)19>_> *
vkt::api::anon_unknown_1::DescriptorSetLayout::create
          (Move<vk::Handle<(vk::HandleType)19>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *param_3)

{
  pointer pVVar1;
  long lVar2;
  VkDescriptorSetLayoutCreateInfo descriptorSetLayoutInfo;
  
  descriptorSetLayoutInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  descriptorSetLayoutInfo.pNext = (void *)0x0;
  descriptorSetLayoutInfo.flags = 0;
  pVVar1 = (res->bindings).
           super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(res->bindings).
                super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
  descriptorSetLayoutInfo.pBindings = (pointer)0x0;
  if (lVar2 != 0) {
    descriptorSetLayoutInfo.pBindings = pVVar1;
  }
  descriptorSetLayoutInfo.bindingCount = (deUint32)(lVar2 / 0x18);
  ::vk::createDescriptorSetLayout
            (__return_storage_ptr__,env->vkd,env->device,&descriptorSetLayoutInfo,
             env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkDescriptorSetLayout> create (const Environment& env, const Resources& res, const Parameters&)
	{
		const VkDescriptorSetLayoutCreateInfo	descriptorSetLayoutInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
			DE_NULL,
			(VkDescriptorSetLayoutCreateFlags)0,
			(deUint32)res.bindings.size(),
			(res.bindings.empty() ? DE_NULL : &res.bindings[0])
		};

		return createDescriptorSetLayout(env.vkd, env.device, &descriptorSetLayoutInfo, env.allocationCallbacks);
	}